

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O1

gkc_tuple * gkc_alloc(gkc_summary *s)

{
  void *ret;
  ulong uVar1;
  gkc_tuple *pgVar2;
  
  uVar1 = s->alloced + 1;
  s->alloced = uVar1;
  if (s->max_alloced < uVar1) {
    s->max_alloced = uVar1;
  }
  pgVar2 = (gkc_tuple *)s->fl;
  if (pgVar2 != (gkc_tuple *)0x0) {
    s->fl = (freelist *)pgVar2->value;
    return pgVar2;
  }
  pgVar2 = (gkc_tuple *)malloc(0x28);
  return pgVar2;
}

Assistant:

static struct gkc_tuple *gkc_alloc(struct gkc_summary *s)
{
    s->alloced++;
    if (s->alloced > s->max_alloced) {
        s->max_alloced = s->alloced;
    }

    if (s->fl) {
        void *ret;
        ret = s->fl;
        s->fl = s->fl->next;
        return ret;
    }
    return malloc(sizeof(struct gkc_tuple));
}